

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_list.hpp
# Opt level: O2

size_t Catch::listTests(Config *config)

{
  pointer pTVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestSpecParser *this;
  IRegistryHub *pIVar3;
  undefined4 extraout_var_01;
  ostream *poVar4;
  undefined4 extraout_var_02;
  pointer pcVar5;
  pointer _str;
  allocator local_139;
  Colour colourGuard;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  undefined1 local_100 [32];
  Config *local_e0;
  TextAttributes local_d8;
  TestSpec testSpec;
  undefined1 local_a0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  pointer local_68;
  pointer pbStack_60;
  pointer local_58;
  pointer pbStack_50;
  pointer local_48;
  pointer pFStack_40;
  TagAliasRegistry *local_38;
  
  iVar2 = (*(config->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])();
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
            (&testSpec.m_filters,
             (vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
             CONCAT44(extraout_var,iVar2));
  iVar2 = (*(config->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])(config);
  if (*(long *)CONCAT44(extraout_var_00,iVar2) == ((long *)CONCAT44(extraout_var_00,iVar2))[1]) {
    std::operator<<((ostream *)&std::cout,"All available test cases:\n");
    TagAliasRegistry::get();
    local_88._M_allocated_capacity = (size_type)&local_78;
    local_88._8_8_ = 0;
    local_78._M_local_buf[0] = '\0';
    local_68 = (pointer)0x0;
    pbStack_60 = (pointer)0x0;
    local_58 = (pointer)0x0;
    pbStack_50 = (pointer)0x0;
    local_48 = (pointer)0x0;
    pFStack_40 = (pointer)0x0;
    local_38 = &TagAliasRegistry::get::instance;
    std::__cxx11::string::string((string *)local_100,"*",(allocator *)&colourGuard);
    this = TestSpecParser::parse((TestSpecParser *)local_a0,(string *)local_100);
    TestSpecParser::testSpec((TestSpec *)&local_d8,this);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::_M_move_assign
              (&testSpec.m_filters,&local_d8);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               &local_d8);
    std::__cxx11::string::~string((string *)local_100);
    TestSpecParser::~TestSpecParser((TestSpecParser *)local_a0);
  }
  else {
    std::operator<<((ostream *)&std::cout,"Matching test cases:\n");
  }
  local_100._16_8_ = 0x4f;
  local_d8.initialIndent = 0xffffffffffffffff;
  local_100[0x18] = '\t';
  local_d8.width = 0x4f;
  local_d8.tabChar = '\t';
  local_100._0_8_ = (pointer)0x2;
  local_100._8_8_ = 4;
  local_d8.indent = 6;
  matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar3 = getRegistryHub();
  iVar2 = (*pIVar3->_vptr_IRegistryHub[3])(pIVar3);
  (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x18))
            ((long *)CONCAT44(extraout_var_01,iVar2),&testSpec,config,&matchedTestCases,0);
  pTVar1 = matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pcVar5 = (pointer)0x0;
  local_e0 = config;
  for (_str = matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>
              ._M_impl.super__Vector_impl_data._M_start; _str != pTVar1; _str = _str + 1) {
    colourGuard.m_moved = false;
    Colour::use((int)((_str->super_TestCaseInfo).properties << 0x1e) >> 0x1f & FileName);
    Tbc::Text::Text((Text *)local_a0,(string *)_str,(TextAttributes *)local_100);
    poVar4 = Tbc::operator<<((ostream *)&std::cout,(Text *)local_a0);
    std::endl<char,std::char_traits<char>>(poVar4);
    Tbc::Text::~Text((Text *)local_a0);
    if ((_str->super_TestCaseInfo).tags._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      Tbc::Text::Text((Text *)local_a0,&(_str->super_TestCaseInfo).tagsAsString,&local_d8);
      poVar4 = Tbc::operator<<((ostream *)&std::cout,(Text *)local_a0);
      std::endl<char,std::char_traits<char>>(poVar4);
      Tbc::Text::~Text((Text *)local_a0);
    }
    Colour::~Colour(&colourGuard);
    pcVar5 = pcVar5 + 1;
  }
  iVar2 = (*(local_e0->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.
            super_NonCopyable._vptr_NonCopyable[0xd])();
  local_a0._0_8_ = pcVar5;
  if (*(long *)CONCAT44(extraout_var_02,iVar2) == ((long *)CONCAT44(extraout_var_02,iVar2))[1]) {
    std::__cxx11::string::string((string *)&colourGuard,"test case",&local_139);
    std::__cxx11::string::string((string *)(local_a0 + 8),(string *)&colourGuard);
    operator<<((ostream *)&std::cout,(pluralise *)local_a0);
    poVar4 = std::operator<<((ostream *)&std::cout,"\n");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  else {
    std::__cxx11::string::string((string *)&colourGuard,"matching test case",&local_139);
    std::__cxx11::string::string((string *)(local_a0 + 8),(string *)&colourGuard);
    operator<<((ostream *)&std::cout,(pluralise *)local_a0);
    poVar4 = std::operator<<((ostream *)&std::cout,"\n");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  std::__cxx11::string::~string((string *)(local_a0 + 8));
  std::__cxx11::string::~string((string *)&colourGuard);
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector(&matchedTestCases);
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
            (&testSpec.m_filters);
  return (size_t)pcVar5;
}

Assistant:

inline std::size_t listTests( Config const& config ) {

        TestSpec testSpec = config.testSpec();
        if( config.testSpec().hasFilters() )
            Catch::cout() << "Matching test cases:\n";
        else {
            Catch::cout() << "All available test cases:\n";
            testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "*" ).testSpec();
        }

        std::size_t matchedTests = 0;
        TextAttributes nameAttr, tagsAttr;
        nameAttr.setInitialIndent( 2 ).setIndent( 4 );
        tagsAttr.setIndent( 6 );

        std::vector<TestCase> matchedTestCases;
        getRegistryHub().getTestCaseRegistry().getFilteredTests( testSpec, config, matchedTestCases );
        for( std::vector<TestCase>::const_iterator it = matchedTestCases.begin(), itEnd = matchedTestCases.end();
                it != itEnd;
                ++it ) {
            matchedTests++;
            TestCaseInfo const& testCaseInfo = it->getTestCaseInfo();
            Colour::Code colour = testCaseInfo.isHidden()
                ? Colour::SecondaryText
                : Colour::None;
            Colour colourGuard( colour );

            Catch::cout() << Text( testCaseInfo.name, nameAttr ) << std::endl;
            if( !testCaseInfo.tags.empty() )
                Catch::cout() << Text( testCaseInfo.tagsAsString, tagsAttr ) << std::endl;
        }

        if( !config.testSpec().hasFilters() )
            Catch::cout() << pluralise( matchedTests, "test case" ) << "\n" << std::endl;
        else
            Catch::cout() << pluralise( matchedTests, "matching test case" ) << "\n" << std::endl;
        return matchedTests;
    }